

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void ft_glyphslot_free_bitmap(FT_GlyphSlot slot)

{
  FT_UInt *pFVar1;
  uchar *puVar2;
  FT_Memory pFVar3;
  
  if ((slot->internal == (FT_Slot_Internal)0x0) || ((slot->internal->flags & 1) == 0)) {
    (slot->bitmap).buffer = (uchar *)0x0;
  }
  else {
    puVar2 = (slot->bitmap).buffer;
    if (puVar2 != (uchar *)0x0) {
      pFVar3 = slot->face->memory;
      (*pFVar3->free)(pFVar3,puVar2);
    }
    (slot->bitmap).buffer = (uchar *)0x0;
    pFVar1 = &slot->internal->flags;
    *pFVar1 = *pFVar1 & 0xfffffffe;
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  ft_glyphslot_free_bitmap( FT_GlyphSlot  slot )
  {
    if ( slot->internal && ( slot->internal->flags & FT_GLYPH_OWN_BITMAP ) )
    {
      FT_Memory  memory = FT_FACE_MEMORY( slot->face );


      FT_FREE( slot->bitmap.buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }
    else
    {
      /* assume that the bitmap buffer was stolen or not */
      /* allocated from the heap                         */
      slot->bitmap.buffer = NULL;
    }
  }